

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::AddErrorOrWarning
          (ErrorPrinter *this,string_view filename,int line,int column,string_view message,
          string_view type,ostream *out)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  size_t sVar5;
  char *local_50;
  size_t local_48;
  char local_40;
  undefined7 uStack_3f;
  
  pcVar4 = filename._M_str;
  sVar5 = filename._M_len;
  local_50 = &local_40;
  local_48 = 0;
  local_40 = '\0';
  if ((this->format_ == ERROR_FORMAT_MSVS) && (this->tree_ != (DiskSourceTree *)0x0)) {
    cVar1 = google::protobuf::compiler::DiskSourceTree::VirtualFileToDiskFile
                      (this->tree_,sVar5,pcVar4,&local_50);
    if (cVar1 != '\0') {
      pcVar4 = local_50;
      sVar5 = local_48;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar4,sVar5);
  if (line != -1) {
    if (this->format_ == ERROR_FORMAT_MSVS) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,line + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") : ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,type._M_str,type._M_len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," in column=",0xb);
    }
    else {
      if (this->format_ != ERROR_FORMAT_GCC) goto LAB_001719f5;
      std::__ostream_insert<char,std::char_traits<char>>(out,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,line + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    }
    std::ostream::operator<<((ostream *)poVar3,column + 1);
  }
LAB_001719f5:
  if (type._M_len == 7) {
    iVar2 = bcmp(type._M_str,"warning",7);
    if (iVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(out,": warning: ",0xb);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(out,message._M_str,message._M_len)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      goto LAB_00171a53;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,": ",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(out,message._M_str,message._M_len);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
LAB_00171a53:
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void AddErrorOrWarning(absl::string_view filename, int line, int column,
                         absl::string_view message, absl::string_view type,
                         std::ostream& out) {
    std::string dfile;
    if (
#ifndef PROTOBUF_OPENSOURCE
        // Print full path when running under MSVS
        format_ == CommandLineInterface::ERROR_FORMAT_MSVS &&
#endif  // !PROTOBUF_OPENSOURCE
        tree_ != nullptr && tree_->VirtualFileToDiskFile(filename, &dfile)) {
      out << dfile;
    } else {
      out << filename;
    }

    // Users typically expect 1-based line/column numbers, so we add 1
    // to each here.
    if (line != -1) {
      // Allow for both GCC- and Visual-Studio-compatible output.
      switch (format_) {
        case CommandLineInterface::ERROR_FORMAT_GCC:
          out << ":" << (line + 1) << ":" << (column + 1);
          break;
        case CommandLineInterface::ERROR_FORMAT_MSVS:
          out << "(" << (line + 1) << ") : " << type
              << " in column=" << (column + 1);
          break;
      }
    }

    if (type == "warning") {
      out << ": warning: " << message << std::endl;
    } else {
      out << ": " << message << std::endl;
    }
  }